

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildAndTestHandler.cxx
# Opt level: O0

int __thiscall
cmCTestBuildAndTestHandler::RunCMakeAndTest(cmCTestBuildAndTestHandler *this,string *outstring)

{
  pointer *resultingConfig_00;
  pointer *this_00;
  cmCTest *pcVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  cmBuildOptions __s;
  bool bVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ostream *poVar6;
  cmGlobalGenerator *pcVar7;
  char *pcVar8;
  reference ppcVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2008;
  string local_1ec8 [32];
  string local_1ea8 [32];
  undefined1 local_1e88 [8];
  ostringstream cmCTestLog_msg_3;
  string local_1d10 [32];
  rep_conflict local_1cf0;
  vector<const_char_*,_std::allocator<const_char_*>_> local_1ce8;
  int local_1cd0;
  int local_1ccc;
  int runTestRes;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_1cc0;
  duration<long,_std::ratio<1L,_1000000000L>_> local_1cb8;
  duration<double,_std::ratio<1L,_1000000000L>_> local_1cb0;
  rep_conflict local_1ca8;
  duration<double,_std::ratio<1L,_1L>_> local_1ca0;
  duration<double,_std::ratio<1L,_1L>_> local_1c98;
  cmDuration remainingTime;
  string *testCommandArg_1;
  iterator __end1_2;
  iterator __begin1_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_2;
  string local_1c50 [32];
  undefined1 local_1c30 [8];
  ostringstream cmCTestLog_msg_2;
  string local_1ab8 [36];
  int local_1a94;
  undefined1 local_1a90 [4];
  int retval;
  string outs;
  value_type local_1a68;
  reference local_1a60;
  string *testCommandArg;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  undefined1 local_1a38 [8];
  vector<const_char_*,_std::allocator<const_char_*>_> testCommand;
  string local_1a00 [32];
  undefined1 local_19e0 [8];
  ostringstream cmCTestLog_msg_1;
  string local_1868 [32];
  reference local_1848;
  string *fail;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  undefined1 local_1808 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  failed;
  cmAlphaNum local_17c0;
  undefined1 local_1790 [8];
  string tempPath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraPaths;
  string resultingConfig;
  string fullPath;
  string local_16f8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_16d8;
  cmDuration local_16b8;
  allocator<char> local_16a9;
  string local_16a8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1681;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1680;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1678;
  iterator local_1658;
  size_type local_1650;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1648;
  int local_162c;
  int retVal;
  cmBuildOptions buildOptions;
  char *config;
  string output;
  duration<long,_std::ratio<1L,_1L>_> local_15f0;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_15e8;
  duration<long,_std::ratio<1L,_1000000000L>_> local_15e0;
  duration<double,_std::ratio<1L,_1000000000L>_> local_15d8;
  rep_conflict local_15d0;
  duration<double,_std::ratio<1L,_1L>_> local_15c8;
  duration<double,_std::ratio<1L,_1L>_> local_15c0;
  cmDuration remainingTime_1;
  string *tar;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  undefined1 local_1580 [8];
  cmMakefile mf;
  string local_d78 [32];
  undefined1 local_d58 [8];
  ostringstream cmCTestLog_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_be0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ba0;
  undefined1 local_b80 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> msg;
  cmWorkingDirectory workdir;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_b30;
  time_point clock_start;
  undefined1 local_b08 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  failed_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraPaths_1;
  string resultingConfig_1;
  string fullPath_1;
  ostringstream out;
  cmCTestBuildAndTestCaptureRAII local_920;
  cmCTestBuildAndTestCaptureRAII captureRAII;
  string cmakeOutString;
  string local_8f0;
  allocator<char> local_8b9;
  string local_8b8;
  undefined1 local_898 [8];
  cmake cm;
  string *outstring_local;
  cmCTestBuildAndTestHandler *this_local;
  
  cm.ProfilingOutput._M_t.
  super___uniq_ptr_impl<cmMakefileProfilingData,_std::default_delete<cmMakefileProfilingData>_>._M_t
  .super__Tuple_impl<0UL,_cmMakefileProfilingData_*,_std::default_delete<cmMakefileProfilingData>_>.
  super__Head_base<0UL,_cmMakefileProfilingData_*,_false>._M_head_impl =
       (__uniq_ptr_data<cmMakefileProfilingData,_std::default_delete<cmMakefileProfilingData>,_true,_true>
        )(__uniq_ptr_data<cmMakefileProfilingData,_std::default_delete<cmMakefileProfilingData>,_true,_true>
          )outstring;
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) != 0) {
    if ((__uniq_ptr_impl<cmMakefileProfilingData,_std::default_delete<cmMakefileProfilingData>_>)
        cm.ProfilingOutput._M_t.
        super___uniq_ptr_impl<cmMakefileProfilingData,_std::default_delete<cmMakefileProfilingData>_>
        ._M_t.
        super__Tuple_impl<0UL,_cmMakefileProfilingData_*,_std::default_delete<cmMakefileProfilingData>_>
        .super__Head_base<0UL,_cmMakefileProfilingData_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<cmMakefileProfilingData,_std::default_delete<cmMakefileProfilingData>_>)0x0
       ) {
      std::__cxx11::string::operator=
                ((string *)
                 cm.ProfilingOutput._M_t.
                 super___uniq_ptr_impl<cmMakefileProfilingData,_std::default_delete<cmMakefileProfilingData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmMakefileProfilingData_*,_std::default_delete<cmMakefileProfilingData>_>
                 .super__Head_base<0UL,_cmMakefileProfilingData_*,_false>._M_head_impl,
                 "--build-and-test requires that the generator be provided using the --build-generator command line option. "
                );
    }
    return 1;
  }
  cmake::cmake((cmake *)local_898,RoleProject,Project,Normal);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8b8,"",&local_8b9);
  cmake::SetHomeDirectory((cmake *)local_898,&local_8b8);
  std::__cxx11::string::~string((string *)&local_8b8);
  std::allocator<char>::~allocator(&local_8b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8f0,"",(allocator<char> *)(cmakeOutString.field_2._M_local_buf + 0xf))
  ;
  cmake::SetHomeOutputDirectory((cmake *)local_898,&local_8f0);
  std::__cxx11::string::~string((string *)&local_8f0);
  std::allocator<char>::~allocator((allocator<char> *)(cmakeOutString.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string((string *)&captureRAII);
  cmCTestBuildAndTestCaptureRAII::cmCTestBuildAndTestCaptureRAII
            (&local_920,(cmake *)local_898,(string *)&captureRAII);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(fullPath_1.field_2._M_local_buf + 8))
  ;
  cmCTest::GetConfigType_abi_cxx11_((this->super_cmCTestGenericHandler).CTest);
  uVar5 = std::__cxx11::string::empty();
  if (((uVar5 & 1) != 0) && (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) == 0)) {
    std::__cxx11::string::string((string *)(resultingConfig_1.field_2._M_local_buf + 8));
    resultingConfig_00 =
         &extraPaths_1.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::string((string *)resultingConfig_00);
    this_00 = &failed_1.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)this_00);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_b08);
    cmCTestTestHandler::FindExecutable
              ((string *)&clock_start,(this->super_cmCTestGenericHandler).CTest,&this->ConfigSample,
               (string *)resultingConfig_00,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this_00,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_b08);
    std::__cxx11::string::operator=
              ((string *)(resultingConfig_1.field_2._M_local_buf + 8),(string *)&clock_start);
    std::__cxx11::string::~string((string *)&clock_start);
    uVar5 = std::__cxx11::string::empty();
    if (((uVar5 & 1) == 0) && (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) == 0)) {
      cmCTest::SetConfigType
                ((this->super_cmCTestGenericHandler).CTest,
                 (string *)
                 &extraPaths_1.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    poVar6 = std::operator<<((ostream *)((long)&fullPath_1.field_2 + 8),
                             "Using config sample with results: ");
    poVar6 = std::operator<<(poVar6,(string *)(resultingConfig_1.field_2._M_local_buf + 8));
    poVar6 = std::operator<<(poVar6," and ");
    poVar6 = std::operator<<(poVar6,(string *)
                                    &extraPaths_1.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_b08);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&failed_1.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string
              ((string *)
               &extraPaths_1.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)(resultingConfig_1.field_2._M_local_buf + 8));
  }
  local_b30.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  poVar6 = std::operator<<((ostream *)((long)&fullPath_1.field_2 + 8),
                           "Internal cmake changing into directory: ");
  poVar6 = std::operator<<(poVar6,(string *)&this->BinaryDir);
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  bVar2 = cmsys::SystemTools::FileIsDirectory(&this->BinaryDir);
  if (!bVar2) {
    cmsys::SystemTools::MakeDirectory(&this->BinaryDir,(mode_t *)0x0);
  }
  cmWorkingDirectory::cmWorkingDirectory
            ((cmWorkingDirectory *)((long)&msg.field_2 + 8),&this->BinaryDir);
  bVar2 = cmWorkingDirectory::Failed((cmWorkingDirectory *)((long)&msg.field_2 + 8));
  if (bVar2) {
    std::operator+(&local_be0,"Failed to change working directory to ",&this->BinaryDir);
    std::operator+(&local_bc0,&local_be0," : ");
    iVar4 = cmWorkingDirectory::GetLastResult((cmWorkingDirectory *)((long)&msg.field_2 + 8));
    pcVar8 = strerror(iVar4);
    std::operator+(&local_ba0,&local_bc0,pcVar8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b80,
                   &local_ba0,"\n");
    std::__cxx11::string::~string((string *)&local_ba0);
    std::__cxx11::string::~string((string *)&local_bc0);
    std::__cxx11::string::~string((string *)&local_be0);
    if ((__uniq_ptr_impl<cmMakefileProfilingData,_std::default_delete<cmMakefileProfilingData>_>)
        cm.ProfilingOutput._M_t.
        super___uniq_ptr_impl<cmMakefileProfilingData,_std::default_delete<cmMakefileProfilingData>_>
        ._M_t.
        super__Tuple_impl<0UL,_cmMakefileProfilingData_*,_std::default_delete<cmMakefileProfilingData>_>
        .super__Head_base<0UL,_cmMakefileProfilingData_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<cmMakefileProfilingData,_std::default_delete<cmMakefileProfilingData>_>)0x0
       ) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d58);
      std::operator<<((ostream *)local_d58,(string *)local_b80);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar8 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildAndTestHandler.cxx"
                   ,0xd5,pcVar8,false);
      std::__cxx11::string::~string(local_d78);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_d58);
    }
    else {
      std::__cxx11::string::operator=
                ((string *)
                 cm.ProfilingOutput._M_t.
                 super___uniq_ptr_impl<cmMakefileProfilingData,_std::default_delete<cmMakefileProfilingData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmMakefileProfilingData_*,_std::default_delete<cmMakefileProfilingData>_>
                 .super__Head_base<0UL,_cmMakefileProfilingData_*,_false>._M_head_impl,
                 (string *)local_b80);
    }
    this_local._4_4_ = 1;
    std::__cxx11::string::~string((string *)local_b80);
    goto LAB_0019f220;
  }
  if ((this->BuildNoCMake & 1U) == 0) {
    iVar4 = RunCMake(this,(string *)
                          cm.ProfilingOutput._M_t.
                          super___uniq_ptr_impl<cmMakefileProfilingData,_std::default_delete<cmMakefileProfilingData>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmMakefileProfilingData_*,_std::default_delete<cmMakefileProfilingData>_>
                          .super__Head_base<0UL,_cmMakefileProfilingData_*,_false>._M_head_impl,
                     (ostringstream *)(fullPath_1.field_2._M_local_buf + 8),(string *)&captureRAII,
                     (cmake *)local_898);
    if (iVar4 != 0) {
      this_local._4_4_ = 1;
      goto LAB_0019f220;
    }
  }
  else {
    cmake::CreateGlobalGenerator
              ((cmake *)&mf.IsSourceFileTryCompile,(string *)local_898,(bool)((char)this + '@'));
    cmake::SetGlobalGenerator
              ((cmake *)local_898,
               (unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> *)
               &mf.IsSourceFileTryCompile);
    std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::~unique_ptr
              ((unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> *)
               &mf.IsSourceFileTryCompile);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      pcVar7 = cmake::GetGlobalGenerator((cmake *)local_898);
      cmake::GetCurrentSnapshot((cmStateSnapshot *)&__range1,(cmake *)local_898);
      cmMakefile::cmMakefile((cmMakefile *)local_1580,pcVar7,(cmStateSnapshot *)&__range1);
      pcVar7 = cmake::GetGlobalGenerator((cmake *)local_898);
      uVar3 = (*pcVar7->_vptr_cmGlobalGenerator[9])(pcVar7,&this->BuildGeneratorPlatform,local_1580)
      ;
      bVar2 = (uVar3 & 1) == 0;
      if (bVar2) {
        this_local._4_4_ = 1;
      }
      cmMakefile::~cmMakefile((cmMakefile *)local_1580);
      if (bVar2) goto LAB_0019f220;
    }
    cmake::LoadCache((cmake *)local_898,&this->BinaryDir);
  }
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->BuildTargets);
  if (bVar2) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::emplace_back<>(&this->BuildTargets);
  }
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->BuildTargets);
  tar = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(&this->BuildTargets);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&tar), bVar2) {
    remainingTime_1.__r =
         (rep_conflict)
         __gnu_cxx::
         __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator*(&__end1);
    local_15c0.__r = 0.0;
    local_15c8 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
    bVar2 = std::chrono::operator>(&this->Timeout,&local_15c8);
    if (bVar2) {
      local_15e8.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      local_15e0.__r = (rep)std::chrono::operator-(&local_15e8,&local_b30);
      local_15d8.__r = (rep_conflict)std::chrono::operator-(&this->Timeout,&local_15e0);
      std::chrono::duration<double,std::ratio<1l,1l>>::
      duration<double,std::ratio<1l,1000000000l>,void>
                ((duration<double,std::ratio<1l,1l>> *)&local_15d0,&local_15d8);
      local_15c0.__r = local_15d0;
      output.field_2._12_4_ = 0;
      std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
                ((duration<long,std::ratio<1l,1l>> *)&local_15f0,
                 (int *)(output.field_2._M_local_buf + 0xc));
      bVar2 = std::chrono::operator<=(&local_15c0,&local_15f0);
      if (bVar2) {
        if ((__uniq_ptr_impl<cmMakefileProfilingData,_std::default_delete<cmMakefileProfilingData>_>
            )cm.ProfilingOutput._M_t.
             super___uniq_ptr_impl<cmMakefileProfilingData,_std::default_delete<cmMakefileProfilingData>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmMakefileProfilingData_*,_std::default_delete<cmMakefileProfilingData>_>
             .super__Head_base<0UL,_cmMakefileProfilingData_*,_false>._M_head_impl !=
            (__uniq_ptr_impl<cmMakefileProfilingData,_std::default_delete<cmMakefileProfilingData>_>
            )0x0) {
          std::__cxx11::string::operator=
                    ((string *)
                     cm.ProfilingOutput._M_t.
                     super___uniq_ptr_impl<cmMakefileProfilingData,_std::default_delete<cmMakefileProfilingData>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmMakefileProfilingData_*,_std::default_delete<cmMakefileProfilingData>_>
                     .super__Head_base<0UL,_cmMakefileProfilingData_*,_false>._M_head_impl,
                     "--build-and-test timeout exceeded. ");
        }
        this_local._4_4_ = 1;
        goto LAB_0019f220;
      }
    }
    std::__cxx11::string::string((string *)&config);
    buildOptions.Clean = false;
    buildOptions.Fast = false;
    buildOptions._2_2_ = 0;
    buildOptions.ResolveMode = Default;
    cmCTest::GetConfigType_abi_cxx11_((this->super_cmCTestGenericHandler).CTest);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      cmCTest::GetConfigType_abi_cxx11_((this->super_cmCTestGenericHandler).CTest);
      buildOptions = (cmBuildOptions)std::__cxx11::string::c_str();
    }
    if (buildOptions == (cmBuildOptions)0x0) {
      buildOptions = (cmBuildOptions)anon_var_dwarf_5a233;
    }
    cmBuildOptions::cmBuildOptions
              ((cmBuildOptions *)&stack0xffffffffffffe9d8,(bool)(~this->BuildNoClean & 1),false,
               Disable);
    pcVar7 = cmake::GetGlobalGenerator((cmake *)local_898);
    local_1680 = &local_1678;
    std::__cxx11::string::string((string *)local_1680,(string *)remainingTime_1.__r);
    local_1658 = &local_1678;
    local_1650 = 1;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(&local_1681);
    __l._M_len = local_1650;
    __l._M_array = local_1658;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_1648,__l,&local_1681);
    __s = buildOptions;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_16a8,(char *)__s,&local_16a9);
    local_16b8.__r = local_15c0.__r;
    local_16d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_16d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_16d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_16d8);
    iVar4 = cmGlobalGenerator::Build
                      (pcVar7,-1,&this->SourceDir,&this->BinaryDir,&this->BuildProject,&local_1648,
                       (string *)&config,&this->BuildMakeProgram,&local_16a8,
                       (cmBuildOptions *)&stack0xffffffffffffe9d8,false,local_16b8,OUTPUT_NONE,
                       &local_16d8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_16d8);
    std::__cxx11::string::~string((string *)&local_16a8);
    std::allocator<char>::~allocator(&local_16a9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1648);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(&local_1681);
    local_2008 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1658;
    do {
      local_2008 = local_2008 + -1;
      std::__cxx11::string::~string((string *)local_2008);
    } while (local_2008 != &local_1678);
    local_162c = iVar4;
    std::operator<<((ostream *)((long)&fullPath_1.field_2 + 8),(string *)&config);
    if (local_162c == 0) {
      bVar2 = false;
    }
    else {
      if ((__uniq_ptr_impl<cmMakefileProfilingData,_std::default_delete<cmMakefileProfilingData>_>)
          cm.ProfilingOutput._M_t.
          super___uniq_ptr_impl<cmMakefileProfilingData,_std::default_delete<cmMakefileProfilingData>_>
          ._M_t.
          super__Tuple_impl<0UL,_cmMakefileProfilingData_*,_std::default_delete<cmMakefileProfilingData>_>
          .super__Head_base<0UL,_cmMakefileProfilingData_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<cmMakefileProfilingData,_std::default_delete<cmMakefileProfilingData>_>)
          0x0) {
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=
                  ((string *)
                   cm.ProfilingOutput._M_t.
                   super___uniq_ptr_impl<cmMakefileProfilingData,_std::default_delete<cmMakefileProfilingData>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmMakefileProfilingData_*,_std::default_delete<cmMakefileProfilingData>_>
                   .super__Head_base<0UL,_cmMakefileProfilingData_*,_false>._M_head_impl,local_16f8)
        ;
        std::__cxx11::string::~string(local_16f8);
      }
      this_local._4_4_ = 1;
      bVar2 = true;
    }
    std::__cxx11::string::~string((string *)&config);
    if (bVar2) goto LAB_0019f220;
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  if ((__uniq_ptr_impl<cmMakefileProfilingData,_std::default_delete<cmMakefileProfilingData>_>)
      cm.ProfilingOutput._M_t.
      super___uniq_ptr_impl<cmMakefileProfilingData,_std::default_delete<cmMakefileProfilingData>_>.
      _M_t.
      super__Tuple_impl<0UL,_cmMakefileProfilingData_*,_std::default_delete<cmMakefileProfilingData>_>
      .super__Head_base<0UL,_cmMakefileProfilingData_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<cmMakefileProfilingData,_std::default_delete<cmMakefileProfilingData>_>)0x0)
  {
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=
              ((string *)
               cm.ProfilingOutput._M_t.
               super___uniq_ptr_impl<cmMakefileProfilingData,_std::default_delete<cmMakefileProfilingData>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmMakefileProfilingData_*,_std::default_delete<cmMakefileProfilingData>_>
               .super__Head_base<0UL,_cmMakefileProfilingData_*,_false>._M_head_impl,
               (string *)(fullPath.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(fullPath.field_2._M_local_buf + 8));
  }
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) != 0) {
    this_local._4_4_ = 0;
    goto LAB_0019f220;
  }
  std::__cxx11::string::string((string *)(resultingConfig.field_2._M_local_buf + 8));
  std::__cxx11::string::string
            ((string *)
             &extraPaths.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&tempPath.field_2 + 8));
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    cmAlphaNum::cmAlphaNum(&local_17c0,&this->ExecutableDirectory);
    cmAlphaNum::cmAlphaNum
              ((cmAlphaNum *)
               &failed.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,'/');
    cmStrCat<std::__cxx11::string>
              ((string *)local_1790,&local_17c0,
               (cmAlphaNum *)
               &failed.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&this->TestCommand);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&tempPath.field_2 + 8),(value_type *)local_1790);
    std::__cxx11::string::~string((string *)local_1790);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_1808);
  cmCTestTestHandler::FindExecutable
            ((string *)&__range2,(this->super_cmCTestGenericHandler).CTest,&this->TestCommand,
             (string *)
             &extraPaths.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&tempPath.field_2 + 8),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_1808);
  std::__cxx11::string::operator=
            ((string *)(resultingConfig.field_2._M_local_buf + 8),(string *)&__range2);
  std::__cxx11::string::~string((string *)&__range2);
  bVar2 = cmsys::SystemTools::FileExists((string *)(resultingConfig.field_2._M_local_buf + 8));
  if (bVar2) {
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_1a38);
    __range1_1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)std::__cxx11::string::c_str();
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_1a38,
               (value_type *)&__range1_1);
    __end1_1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&this->TestCommandArgs);
    testCommandArg =
         (string *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&this->TestCommandArgs);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1_1,
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&testCommandArg), bVar2) {
      local_1a60 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&__end1_1);
      local_1a68 = (value_type)std::__cxx11::string::c_str();
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_1a38,&local_1a68);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1_1);
    }
    outs.field_2._8_8_ = 0;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_1a38,
               (value_type *)((long)&outs.field_2 + 8));
    std::__cxx11::string::string((string *)local_1a90);
    local_1a94 = 0;
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      poVar6 = std::operator<<((ostream *)((long)&fullPath_1.field_2 + 8),"Run test in directory: ")
      ;
      poVar6 = std::operator<<(poVar6,(string *)&this->BuildRunDir);
      std::operator<<(poVar6,"\n");
      bVar2 = cmWorkingDirectory::SetDirectory
                        ((cmWorkingDirectory *)((long)&msg.field_2 + 8),&this->BuildRunDir);
      if (bVar2) goto LAB_0019ec13;
      poVar6 = std::operator<<((ostream *)((long)&fullPath_1.field_2 + 8),
                               "Failed to change working directory : ");
      iVar4 = cmWorkingDirectory::GetLastResult((cmWorkingDirectory *)((long)&msg.field_2 + 8));
      pcVar8 = strerror(iVar4);
      poVar6 = std::operator<<(poVar6,pcVar8);
      std::operator<<(poVar6,"\n");
      if ((__uniq_ptr_impl<cmMakefileProfilingData,_std::default_delete<cmMakefileProfilingData>_>)
          cm.ProfilingOutput._M_t.
          super___uniq_ptr_impl<cmMakefileProfilingData,_std::default_delete<cmMakefileProfilingData>_>
          ._M_t.
          super__Tuple_impl<0UL,_cmMakefileProfilingData_*,_std::default_delete<cmMakefileProfilingData>_>
          .super__Head_base<0UL,_cmMakefileProfilingData_*,_false>._M_head_impl ==
          (__uniq_ptr_impl<cmMakefileProfilingData,_std::default_delete<cmMakefileProfilingData>_>)
          0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c30);
        std::__cxx11::ostringstream::str();
        std::operator<<((ostream *)local_1c30,local_1c50);
        std::__cxx11::string::~string(local_1c50);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar8 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildAndTestHandler.cxx"
                     ,0x154,pcVar8,false);
        std::__cxx11::string::~string((string *)&__range1_2);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c30);
      }
      else {
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=
                  ((string *)
                   cm.ProfilingOutput._M_t.
                   super___uniq_ptr_impl<cmMakefileProfilingData,_std::default_delete<cmMakefileProfilingData>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmMakefileProfilingData_*,_std::default_delete<cmMakefileProfilingData>_>
                   .super__Head_base<0UL,_cmMakefileProfilingData_*,_false>._M_head_impl,local_1ab8)
        ;
        std::__cxx11::string::~string(local_1ab8);
      }
      this_local._4_4_ = 1;
    }
    else {
LAB_0019ec13:
      poVar6 = std::operator<<((ostream *)((long)&fullPath_1.field_2 + 8),"Running test command: \""
                              );
      poVar6 = std::operator<<(poVar6,(string *)(resultingConfig.field_2._M_local_buf + 8));
      std::operator<<(poVar6,"\"");
      __end1_2 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(&this->TestCommandArgs);
      testCommandArg_1 =
           (string *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&this->TestCommandArgs);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end1_2,
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&testCommandArg_1), bVar2) {
        remainingTime.__r =
             (rep_conflict)
             __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1_2);
        poVar6 = std::operator<<((ostream *)((long)&fullPath_1.field_2 + 8)," \"");
        poVar6 = std::operator<<(poVar6,(string *)remainingTime.__r);
        std::operator<<(poVar6,"\"");
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end1_2);
      }
      std::operator<<((ostream *)((long)&fullPath_1.field_2 + 8),"\n");
      local_1c98.__r = 0.0;
      local_1ca0 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
      bVar2 = std::chrono::operator>(&this->Timeout,&local_1ca0);
      if (bVar2) {
        local_1cc0.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
        local_1cb8.__r = (rep)std::chrono::operator-(&local_1cc0,&local_b30);
        local_1cb0.__r = (rep_conflict)std::chrono::operator-(&this->Timeout,&local_1cb8);
        std::chrono::duration<double,std::ratio<1l,1l>>::
        duration<double,std::ratio<1l,1000000000l>,void>
                  ((duration<double,std::ratio<1l,1l>> *)&local_1ca8,&local_1cb0);
        local_1c98.__r = local_1ca8;
        local_1ccc = 0;
        std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
                  ((duration<long,std::ratio<1l,1l>> *)&runTestRes,&local_1ccc);
        bVar2 = std::chrono::operator<=
                          (&local_1c98,(duration<long,_std::ratio<1L,_1L>_> *)&runTestRes);
        if (bVar2) {
          if ((__uniq_ptr_impl<cmMakefileProfilingData,_std::default_delete<cmMakefileProfilingData>_>
               )cm.ProfilingOutput._M_t.
                super___uniq_ptr_impl<cmMakefileProfilingData,_std::default_delete<cmMakefileProfilingData>_>
                ._M_t.
                super__Tuple_impl<0UL,_cmMakefileProfilingData_*,_std::default_delete<cmMakefileProfilingData>_>
                .super__Head_base<0UL,_cmMakefileProfilingData_*,_false>._M_head_impl !=
              (__uniq_ptr_impl<cmMakefileProfilingData,_std::default_delete<cmMakefileProfilingData>_>
               )0x0) {
            std::__cxx11::string::operator=
                      ((string *)
                       cm.ProfilingOutput._M_t.
                       super___uniq_ptr_impl<cmMakefileProfilingData,_std::default_delete<cmMakefileProfilingData>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmMakefileProfilingData_*,_std::default_delete<cmMakefileProfilingData>_>
                       .super__Head_base<0UL,_cmMakefileProfilingData_*,_false>._M_head_impl,
                       "--build-and-test timeout exceeded. ");
          }
          this_local._4_4_ = 1;
          goto LAB_0019f188;
        }
      }
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
                (&local_1ce8,(vector<const_char_*,_std::allocator<const_char_*>_> *)local_1a38);
      local_1cf0 = local_1c98.__r;
      iVar4 = cmCTest::RunTest(pcVar1,&local_1ce8,(string *)local_1a90,&local_1a94,(ostream *)0x0,
                               (cmDuration)local_1c98.__r,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)0x0,Auto);
      std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector(&local_1ce8);
      local_1cd0 = iVar4;
      if ((iVar4 != 4) || (local_1a94 != 0)) {
        poVar6 = std::operator<<((ostream *)((long)&fullPath_1.field_2 + 8),"Test command failed: ")
        ;
        ppcVar9 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_1a38,0);
        poVar6 = std::operator<<(poVar6,*ppcVar9);
        std::operator<<(poVar6,"\n");
        local_1a94 = 1;
      }
      poVar6 = std::operator<<((ostream *)((long)&fullPath_1.field_2 + 8),(string *)local_1a90);
      std::operator<<(poVar6,"\n");
      if ((__uniq_ptr_impl<cmMakefileProfilingData,_std::default_delete<cmMakefileProfilingData>_>)
          cm.ProfilingOutput._M_t.
          super___uniq_ptr_impl<cmMakefileProfilingData,_std::default_delete<cmMakefileProfilingData>_>
          ._M_t.
          super__Tuple_impl<0UL,_cmMakefileProfilingData_*,_std::default_delete<cmMakefileProfilingData>_>
          .super__Head_base<0UL,_cmMakefileProfilingData_*,_false>._M_head_impl ==
          (__uniq_ptr_impl<cmMakefileProfilingData,_std::default_delete<cmMakefileProfilingData>_>)
          0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e88);
        std::__cxx11::ostringstream::str();
        poVar6 = std::operator<<((ostream *)local_1e88,local_1ea8);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_1ea8);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar8 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildAndTestHandler.cxx"
                     ,0x178,pcVar8,false);
        std::__cxx11::string::~string(local_1ec8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e88);
      }
      else {
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=
                  ((string *)
                   cm.ProfilingOutput._M_t.
                   super___uniq_ptr_impl<cmMakefileProfilingData,_std::default_delete<cmMakefileProfilingData>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmMakefileProfilingData_*,_std::default_delete<cmMakefileProfilingData>_>
                   .super__Head_base<0UL,_cmMakefileProfilingData_*,_false>._M_head_impl,local_1d10)
        ;
        std::__cxx11::string::~string(local_1d10);
      }
      this_local._4_4_ = local_1a94;
    }
LAB_0019f188:
    std::__cxx11::string::~string((string *)local_1a90);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_1a38);
  }
  else {
    poVar6 = std::operator<<((ostream *)((long)&fullPath_1.field_2 + 8),
                             "Could not find path to executable, perhaps it was not built: ");
    poVar6 = std::operator<<(poVar6,(string *)&this->TestCommand);
    std::operator<<(poVar6,"\n");
    std::operator<<((ostream *)((long)&fullPath_1.field_2 + 8),"tried to find it in these places:\n"
                   );
    poVar6 = std::operator<<((ostream *)((long)&fullPath_1.field_2 + 8),
                             (string *)(resultingConfig.field_2._M_local_buf + 8));
    std::operator<<(poVar6,"\n");
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_1808);
    fail = (string *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1808);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&fail), bVar2) {
      local_1848 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&__end2);
      poVar6 = std::operator<<((ostream *)((long)&fullPath_1.field_2 + 8),(string *)local_1848);
      std::operator<<(poVar6,"\n");
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    if ((__uniq_ptr_impl<cmMakefileProfilingData,_std::default_delete<cmMakefileProfilingData>_>)
        cm.ProfilingOutput._M_t.
        super___uniq_ptr_impl<cmMakefileProfilingData,_std::default_delete<cmMakefileProfilingData>_>
        ._M_t.
        super__Tuple_impl<0UL,_cmMakefileProfilingData_*,_std::default_delete<cmMakefileProfilingData>_>
        .super__Head_base<0UL,_cmMakefileProfilingData_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<cmMakefileProfilingData,_std::default_delete<cmMakefileProfilingData>_>)0x0
       ) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_19e0);
      std::__cxx11::ostringstream::str();
      std::operator<<((ostream *)local_19e0,local_1a00);
      std::__cxx11::string::~string(local_1a00);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar8 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildAndTestHandler.cxx"
                   ,0x13e,pcVar8,false);
      std::__cxx11::string::~string
                ((string *)
                 &testCommand.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_19e0);
    }
    else {
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=
                ((string *)
                 cm.ProfilingOutput._M_t.
                 super___uniq_ptr_impl<cmMakefileProfilingData,_std::default_delete<cmMakefileProfilingData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmMakefileProfilingData_*,_std::default_delete<cmMakefileProfilingData>_>
                 .super__Head_base<0UL,_cmMakefileProfilingData_*,_false>._M_head_impl,local_1868);
      std::__cxx11::string::~string(local_1868);
    }
    this_local._4_4_ = 1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1808);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&tempPath.field_2 + 8));
  std::__cxx11::string::~string
            ((string *)
             &extraPaths.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)(resultingConfig.field_2._M_local_buf + 8));
LAB_0019f220:
  cmWorkingDirectory::~cmWorkingDirectory((cmWorkingDirectory *)((long)&msg.field_2 + 8));
  std::__cxx11::ostringstream::~ostringstream
            ((ostringstream *)(fullPath_1.field_2._M_local_buf + 8));
  cmCTestBuildAndTestCaptureRAII::~cmCTestBuildAndTestCaptureRAII(&local_920);
  std::__cxx11::string::~string((string *)&captureRAII);
  cmake::~cmake((cmake *)local_898);
  return this_local._4_4_;
}

Assistant:

int cmCTestBuildAndTestHandler::RunCMakeAndTest(std::string* outstring)
{
  // if the generator and make program are not specified then it is an error
  if (this->BuildGenerator.empty()) {
    if (outstring) {
      *outstring = "--build-and-test requires that the generator "
                   "be provided using the --build-generator "
                   "command line option. ";
    }
    return 1;
  }

  cmake cm(cmake::RoleProject, cmState::Project);
  cm.SetHomeDirectory("");
  cm.SetHomeOutputDirectory("");
  std::string cmakeOutString;
  cmCTestBuildAndTestCaptureRAII captureRAII(cm, cmakeOutString);
  static_cast<void>(captureRAII);
  std::ostringstream out;

  if (this->CTest->GetConfigType().empty() && !this->ConfigSample.empty()) {
    // use the config sample to set the ConfigType
    std::string fullPath;
    std::string resultingConfig;
    std::vector<std::string> extraPaths;
    std::vector<std::string> failed;
    fullPath = cmCTestTestHandler::FindExecutable(
      this->CTest, this->ConfigSample, resultingConfig, extraPaths, failed);
    if (!fullPath.empty() && !resultingConfig.empty()) {
      this->CTest->SetConfigType(resultingConfig);
    }
    out << "Using config sample with results: " << fullPath << " and "
        << resultingConfig << std::endl;
  }

  // we need to honor the timeout specified, the timeout include cmake, build
  // and test time
  auto clock_start = std::chrono::steady_clock::now();

  // make sure the binary dir is there
  out << "Internal cmake changing into directory: " << this->BinaryDir
      << std::endl;
  if (!cmSystemTools::FileIsDirectory(this->BinaryDir)) {
    cmSystemTools::MakeDirectory(this->BinaryDir);
  }
  cmWorkingDirectory workdir(this->BinaryDir);
  if (workdir.Failed()) {
    auto msg = "Failed to change working directory to " + this->BinaryDir +
      " : " + std::strerror(workdir.GetLastResult()) + "\n";
    if (outstring) {
      *outstring = msg;
    } else {
      cmCTestLog(this->CTest, ERROR_MESSAGE, msg);
    }
    return 1;
  }

  if (this->BuildNoCMake) {
    // Make the generator available for the Build call below.
    cm.SetGlobalGenerator(cm.CreateGlobalGenerator(this->BuildGenerator));
    if (!this->BuildGeneratorPlatform.empty()) {
      cmMakefile mf(cm.GetGlobalGenerator(), cm.GetCurrentSnapshot());
      if (!cm.GetGlobalGenerator()->SetGeneratorPlatform(
            this->BuildGeneratorPlatform, &mf)) {
        return 1;
      }
    }

    // Load the cache to make CMAKE_MAKE_PROGRAM available.
    cm.LoadCache(this->BinaryDir);
  } else {
    // do the cmake step, no timeout here since it is not a sub process
    if (this->RunCMake(outstring, out, cmakeOutString, &cm)) {
      return 1;
    }
  }

  // do the build
  if (this->BuildTargets.empty()) {
    this->BuildTargets.emplace_back();
  }
  for (std::string const& tar : this->BuildTargets) {
    cmDuration remainingTime = std::chrono::seconds(0);
    if (this->Timeout > cmDuration::zero()) {
      remainingTime =
        this->Timeout - (std::chrono::steady_clock::now() - clock_start);
      if (remainingTime <= std::chrono::seconds(0)) {
        if (outstring) {
          *outstring = "--build-and-test timeout exceeded. ";
        }
        return 1;
      }
    }
    std::string output;
    const char* config = nullptr;
    if (!this->CTest->GetConfigType().empty()) {
      config = this->CTest->GetConfigType().c_str();
    }
#ifdef CMAKE_INTDIR
    if (!config) {
      config = CMAKE_INTDIR;
    }
#endif
    if (!config) {
      config = "Debug";
    }

    cmBuildOptions buildOptions(!this->BuildNoClean, false,
                                PackageResolveMode::Disable);
    int retVal = cm.GetGlobalGenerator()->Build(
      cmake::NO_BUILD_PARALLEL_LEVEL, this->SourceDir, this->BinaryDir,
      this->BuildProject, { tar }, output, this->BuildMakeProgram, config,
      buildOptions, false, remainingTime);
    out << output;
    // if the build failed then return
    if (retVal) {
      if (outstring) {
        *outstring = out.str();
      }
      return 1;
    }
  }
  if (outstring) {
    *outstring = out.str();
  }

  // if no test was specified then we are done
  if (this->TestCommand.empty()) {
    return 0;
  }

  // now run the compiled test if we can find it
  // store the final location in fullPath
  std::string fullPath;
  std::string resultingConfig;
  std::vector<std::string> extraPaths;
  // if this->ExecutableDirectory is set try that as well
  if (!this->ExecutableDirectory.empty()) {
    std::string tempPath =
      cmStrCat(this->ExecutableDirectory, '/', this->TestCommand);
    extraPaths.push_back(tempPath);
  }
  std::vector<std::string> failed;
  fullPath = cmCTestTestHandler::FindExecutable(
    this->CTest, this->TestCommand, resultingConfig, extraPaths, failed);

  if (!cmSystemTools::FileExists(fullPath)) {
    out << "Could not find path to executable, perhaps it was not built: "
        << this->TestCommand << "\n";
    out << "tried to find it in these places:\n";
    out << fullPath << "\n";
    for (std::string const& fail : failed) {
      out << fail << "\n";
    }
    if (outstring) {
      *outstring = out.str();
    } else {
      cmCTestLog(this->CTest, ERROR_MESSAGE, out.str());
    }
    return 1;
  }

  std::vector<const char*> testCommand;
  testCommand.push_back(fullPath.c_str());
  for (std::string const& testCommandArg : this->TestCommandArgs) {
    testCommand.push_back(testCommandArg.c_str());
  }
  testCommand.push_back(nullptr);
  std::string outs;
  int retval = 0;
  // run the test from the this->BuildRunDir if set
  if (!this->BuildRunDir.empty()) {
    out << "Run test in directory: " << this->BuildRunDir << "\n";
    if (!workdir.SetDirectory(this->BuildRunDir)) {
      out << "Failed to change working directory : "
          << std::strerror(workdir.GetLastResult()) << "\n";
      if (outstring) {
        *outstring = out.str();
      } else {
        cmCTestLog(this->CTest, ERROR_MESSAGE, out.str());
      }
      return 1;
    }
  }
  out << "Running test command: \"" << fullPath << "\"";
  for (std::string const& testCommandArg : this->TestCommandArgs) {
    out << " \"" << testCommandArg << "\"";
  }
  out << "\n";

  // how much time is remaining
  cmDuration remainingTime = std::chrono::seconds(0);
  if (this->Timeout > cmDuration::zero()) {
    remainingTime =
      this->Timeout - (std::chrono::steady_clock::now() - clock_start);
    if (remainingTime <= std::chrono::seconds(0)) {
      if (outstring) {
        *outstring = "--build-and-test timeout exceeded. ";
      }
      return 1;
    }
  }

  int runTestRes = this->CTest->RunTest(testCommand, &outs, &retval, nullptr,
                                        remainingTime, nullptr);

  if (runTestRes != cmsysProcess_State_Exited || retval != 0) {
    out << "Test command failed: " << testCommand[0] << "\n";
    retval = 1;
  }

  out << outs << "\n";
  if (outstring) {
    *outstring = out.str();
  } else {
    cmCTestLog(this->CTest, OUTPUT, out.str() << std::endl);
  }
  return retval;
}